

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitDecPOMDPDiscrete.cpp
# Opt level: O0

void PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile
               (string *filename,DecPOMDPDiscreteInterface *decpomdp)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  ostream *poVar5;
  void *pvVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  const_reference pvVar10;
  long *in_RSI;
  string *in_RDI;
  double dVar11;
  Index i_5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs_2;
  Index s0_2;
  Index a_3;
  Index i_4;
  Index i_3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *oIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs_1;
  Index s1_1;
  Index o_1;
  Index a_2;
  Index i_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs;
  Index s1;
  Index s0_1;
  Index a_1;
  double p;
  Index o;
  Index i_1;
  Index a;
  Index i;
  double bs;
  Index s0;
  StateDistribution *isd;
  Index s;
  stringstream ss;
  ofstream fp;
  size_t nrS;
  size_t nrAg;
  string *in_stack_fffffffffffff958;
  E *in_stack_fffffffffffff960;
  uint local_4c4;
  uint local_4b8;
  uint local_4b4;
  uint local_4b0;
  uint local_4ac;
  uint local_498;
  uint local_494;
  uint local_490;
  uint local_48c;
  uint local_47c;
  uint local_478;
  uint local_474;
  string local_468 [32];
  uint local_448;
  uint local_444;
  string local_440 [32];
  uint local_420;
  uint local_41c;
  double local_418;
  uint local_40c;
  long *local_408;
  string local_400 [32];
  uint local_3e0;
  undefined1 local_3d9;
  stringstream local_3b8 [16];
  ostream local_3a8 [392];
  long local_220 [64];
  ulong local_20;
  ulong local_18;
  long *local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = (**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0x40)) + 0x10))
                       ((long)in_RSI + *(long *)(*in_RSI + -0x40));
  local_20 = (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x30))
                       ((long)local_10 + *(long *)(*local_10 + -0xb8));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_220,pcVar3,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_3b8);
    poVar5 = std::operator<<(local_3a8,
                             "PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile: failed to open file "
                            );
    std::operator<<(poVar5,local_8);
    local_3d9 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    E::E(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_3d9 = 0;
    __cxa_throw(uVar4,&E::typeinfo,E::~E);
  }
  poVar5 = std::operator<<((ostream *)local_220,"agents: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,local_18);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)local_220,"discount: ");
  dVar11 = (double)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb0)) + 0x70))
                             ((long)local_10 + *(long *)(*local_10 + -0xb0));
  pvVar6 = (void *)std::ostream::operator<<(poVar5,dVar11);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  iVar2 = (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb0)) + 0x80))
                    ((long)local_10 + *(long *)(*local_10 + -0xb0));
  if (iVar2 == 0) {
    poVar5 = std::operator<<((ostream *)local_220,"values: reward");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else if (iVar2 == 1) {
    poVar5 = std::operator<<((ostream *)local_220,"values: cost");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)local_220,"states:");
  for (local_3e0 = 0; local_3e0 < local_20; local_3e0 = local_3e0 + 1) {
    poVar5 = std::operator<<((ostream *)local_220," ");
    plVar7 = (long *)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x38))
                               ((long)local_10 + *(long *)(*local_10 + -0xb8),local_3e0);
    (**(code **)(*plVar7 + 0x18))(local_400);
    std::operator<<(poVar5,local_400);
    std::__cxx11::string::~string(local_400);
  }
  std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
  local_408 = (long *)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x50))
                                ((long)local_10 + *(long *)(*local_10 + -0xb8));
  poVar5 = std::operator<<((ostream *)local_220,"start:");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  for (local_40c = 0; local_40c < local_20; local_40c = local_40c + 1) {
    if (local_40c != 0) {
      std::operator<<((ostream *)local_220," ");
    }
    local_418 = (double)(**(code **)(*local_408 + 0x10))(local_408,local_40c);
    std::ostream::operator<<(local_220,local_418);
  }
  std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)local_220,"actions:");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  for (local_41c = 0; local_41c != local_18; local_41c = local_41c + 1) {
    for (local_420 = 0; uVar9 = (ulong)local_420,
        uVar8 = (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x60))
                          ((long)local_10 + *(long *)(*local_10 + -0xb8),local_41c), uVar9 < uVar8;
        local_420 = local_420 + 1) {
      if (local_420 != 0) {
        std::operator<<((ostream *)local_220," ");
      }
      plVar7 = (long *)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x78)
                       )((long)local_10 + *(long *)(*local_10 + -0xb8),local_41c,local_420);
      (**(code **)(*plVar7 + 0x18))(local_440);
      std::operator<<((ostream *)local_220,local_440);
      std::__cxx11::string::~string(local_440);
    }
    std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
  }
  poVar5 = std::operator<<((ostream *)local_220,"observations:");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  for (local_444 = 0; local_444 != local_18; local_444 = local_444 + 1) {
    for (local_448 = 0; uVar9 = (ulong)local_448,
        uVar8 = (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0xc0))
                          ((long)local_10 + *(long *)(*local_10 + -0xb8),local_444), uVar9 < uVar8;
        local_448 = local_448 + 1) {
      if (local_448 != 0) {
        std::operator<<((ostream *)local_220," ");
      }
      plVar7 = (long *)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0xd0)
                       )((long)local_10 + *(long *)(*local_10 + -0xb8),local_444,local_448);
      (**(code **)(*plVar7 + 0x18))(local_468);
      std::operator<<((ostream *)local_220,local_468);
      std::__cxx11::string::~string(local_468);
    }
    std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
  }
  for (local_474 = 0;
      uVar9 = (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x68))
                        ((long)local_10 + *(long *)(*local_10 + -0xb8)), local_474 < uVar9;
      local_474 = local_474 + 1) {
    for (local_478 = 0; local_478 < local_20; local_478 = local_478 + 1) {
      for (local_47c = 0; local_47c < local_20; local_47c = local_47c + 1) {
        dVar11 = (double)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) +
                                     0x108))((long)local_10 + *(long *)(*local_10 + -0xb8),local_478
                                             ,local_474,local_47c);
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x98))
                    ((long)local_10 + *(long *)(*local_10 + -0xb8),local_474);
          std::operator<<((ostream *)local_220,"T:");
          for (local_48c = 0; local_48c != local_18; local_48c = local_48c + 1) {
            poVar5 = std::operator<<((ostream *)local_220," ");
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
            std::ostream::operator<<(poVar5,*pvVar10);
          }
          poVar5 = std::operator<<((ostream *)local_220," : ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_478);
          poVar5 = std::operator<<(poVar5," : ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_47c);
          poVar5 = std::operator<<(poVar5," : ");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,dVar11);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        }
      }
    }
  }
  for (local_490 = 0;
      uVar9 = (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x68))
                        ((long)local_10 + *(long *)(*local_10 + -0xb8)), local_490 < uVar9;
      local_490 = local_490 + 1) {
    for (local_494 = 0;
        uVar9 = (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 200))
                          ((long)local_10 + *(long *)(*local_10 + -0xb8)), local_494 < uVar9;
        local_494 = local_494 + 1) {
      for (local_498 = 0; local_498 < local_20; local_498 = local_498 + 1) {
        dVar11 = (double)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) +
                                     0x118))((long)local_10 + *(long *)(*local_10 + -0xb8),local_490
                                             ,local_498,local_494);
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x98))
                    ((long)local_10 + *(long *)(*local_10 + -0xb8),local_490);
          (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0xe8))
                    ((long)local_10 + *(long *)(*local_10 + -0xb8),local_494);
          std::operator<<((ostream *)local_220,"O:");
          for (local_4ac = 0; local_4ac != local_18; local_4ac = local_4ac + 1) {
            poVar5 = std::operator<<((ostream *)local_220," ");
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
            std::ostream::operator<<(poVar5,*pvVar10);
          }
          poVar5 = std::operator<<((ostream *)local_220," : ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_498);
          std::operator<<(poVar5," :");
          for (local_4b0 = 0; local_4b0 != local_18; local_4b0 = local_4b0 + 1) {
            poVar5 = std::operator<<((ostream *)local_220," ");
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
            std::ostream::operator<<(poVar5,*pvVar10);
          }
          poVar5 = std::operator<<((ostream *)local_220," : ");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,dVar11);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        }
      }
    }
  }
  for (local_4b4 = 0;
      uVar9 = (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x68))
                        ((long)local_10 + *(long *)(*local_10 + -0xb8)), local_4b4 < uVar9;
      local_4b4 = local_4b4 + 1) {
    for (local_4b8 = 0; local_4b8 < local_20; local_4b8 = local_4b8 + 1) {
      dVar11 = (double)(**(code **)(*local_10 + 0xc0))(local_10,local_4b8,local_4b4);
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x98))
                  ((long)local_10 + *(long *)(*local_10 + -0xb8),local_4b4);
        std::operator<<((ostream *)local_220,"R:");
        for (local_4c4 = 0; local_4c4 != local_18; local_4c4 = local_4c4 + 1) {
          poVar5 = std::operator<<((ostream *)local_220," ");
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
          std::ostream::operator<<(poVar5,*pvVar10);
        }
        poVar5 = std::operator<<((ostream *)local_220," : ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_4b8);
        in_stack_fffffffffffff960 = (E *)std::operator<<(poVar5," : * : * : ");
        in_stack_fffffffffffff958 =
             (string *)std::ostream::operator<<(in_stack_fffffffffffff960,dVar11);
        std::ostream::operator<<(in_stack_fffffffffffff958,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile(
    const string & filename,
    const DecPOMDPDiscreteInterface *decpomdp)
{
    size_t nrAg=decpomdp->GetNrAgents(),
        nrS=decpomdp->GetNrStates();
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile: failed to open file "
           << filename;
        throw(E(ss.str()));
    }

    fp << "agents: " << nrAg << endl;
    fp << "discount: " << decpomdp->GetDiscount() << endl;
    switch(decpomdp->GetRewardType())
    {
    case REWARD:
        fp << "values: reward" << endl;
        break;
    case COST:
        fp << "values: cost" << endl;
    }

    fp << "states:";
    for(Index s=0;s<nrS;s++)
        fp << " "  << decpomdp->GetState(s)->SoftPrintBrief();
    fp << endl;

    StateDistribution* isd = decpomdp->GetISD();
    fp << "start:" << endl;
    for(Index s0=0;s0<nrS;s0++)
    {
        if(s0>0)
            fp << " ";
        double bs = isd->GetProbability(s0);
        fp <<  bs;
    }
    fp << endl;

    fp << "actions:" << endl;
    for(Index i=0;i!=nrAg;++i)
    {
        for(Index a=0;a<decpomdp->GetNrActions(i);a++)
        {
            if(a>0)
                fp << " ";
            fp << decpomdp->GetAction(i,a)->SoftPrintBrief();
        }
        fp << endl;
    }

    fp << "observations:" << endl;
    for(Index i=0;i!=nrAg;++i)
    {
        for(Index o=0;o<decpomdp->GetNrObservations(i);o++)
        {
            if(o>0)
                fp << " ";
            fp << decpomdp->GetObservation(i,o)->SoftPrintBrief();
        }
        fp << endl;
    }

    double p;
    for(Index a=0;a<decpomdp->GetNrJointActions();a++)
        for(Index s0=0;s0<nrS;s0++)
            for(Index s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetTransitionProbability(s0,a,s1);
                if(p!=0)
                {
                    const vector<Index> &aIs=decpomdp->JointToIndividualActionIndices(a);
                    fp << "T:";
                    for(Index i=0;i!=nrAg;++i)
                        fp << " " << aIs.at(i);
                    fp << " : " << s0 << " : " << s1 << " : " 
                       << p << endl;
                }
            }

    for(Index a=0;a<decpomdp->GetNrJointActions();a++)
        for(Index o=0;o<decpomdp->GetNrJointObservations();o++)
            for(Index s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetObservationProbability(a,s1,o);
                if(p!=0)
                {
                    const vector<Index> &aIs=decpomdp->JointToIndividualActionIndices(a);
                    const vector<Index> &oIs=decpomdp->JointToIndividualObservationIndices(o);
                    fp << "O:";

                    for(Index i=0;i!=nrAg;++i)
                        fp << " " << aIs.at(i);

                    fp << " : " << s1 << " :";

                    for(Index i=0;i!=nrAg;++i)
                        fp << " " << oIs.at(i);
                    fp << " : " << p << endl;
                }
            }

    for(Index a=0;a<decpomdp->GetNrJointActions();a++)
        for(Index s0=0;s0<nrS;s0++)
        {
            p=decpomdp->GetReward(s0,a);
            if(p!=0)
            {
                const vector<Index> &aIs=decpomdp->JointToIndividualActionIndices(a);
                fp << "R:";

                for(Index i=0;i!=nrAg;++i)
                    fp << " " << aIs.at(i);
                fp << " : " << s0 << " : * : * : " << p << endl;
            }
        }
}